

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O1

bool __thiscall sf::priv::GlxContext::makeCurrent(GlxContext *this,bool current)

{
  int iVar1;
  GLXContext p_Var2;
  GLXDrawable GVar3;
  Display *pDVar4;
  
  p_Var2 = this->m_context;
  if (p_Var2 == (GLXContext)0x0) {
    return false;
  }
  if (current) {
    GVar3 = this->m_pbuffer;
    if (GVar3 != 0) {
      iVar1 = (*sf_glad_glXMakeContextCurrent)(this->m_display,GVar3,GVar3,p_Var2);
      goto LAB_0019393d;
    }
    GVar3 = this->m_window;
    if (GVar3 == 0) {
      return false;
    }
    pDVar4 = this->m_display;
  }
  else {
    pDVar4 = this->m_display;
    GVar3 = 0;
    p_Var2 = (GLXContext)0x0;
  }
  iVar1 = (*sf_glad_glXMakeCurrent)(pDVar4,GVar3,p_Var2);
LAB_0019393d:
  return iVar1 != 0;
}

Assistant:

bool GlxContext::makeCurrent(bool current)
{
    if (!m_context)
        return false;

#if defined(GLX_DEBUGGING)
    GlxErrorHandler handler(m_display);
#endif

    bool result = false;

    if (current)
    {
        if (m_pbuffer)
        {
            result = glXMakeContextCurrent(m_display, m_pbuffer, m_pbuffer, m_context);
        }
        else if (m_window)
        {
            result = glXMakeCurrent(m_display, m_window, m_context);
        }
    }
    else
    {
        result = glXMakeCurrent(m_display, None, NULL);
    }

#if defined(GLX_DEBUGGING)
    if (glxErrorOccurred)
        err() << "GLX error in GlxContext::makeCurrent()" << std::endl;
#endif

    return result;
}